

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::removeSatisfiedClause(Solver *this,CRef cr,bool remove_from_proof)

{
  int iVar1;
  CRef CVar2;
  ulong *puVar3;
  ulong uVar4;
  lbool *plVar5;
  int iVar6;
  Lit unit;
  vec<Minisat::Lit> local_38;
  Lit local_1c;
  
  if (this->drup_file != (FILE *)0x0) {
    puVar3 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
    if ((*puVar3 & 0xfffffffc00000000) == 0x800000000) {
      plVar5 = (this->assigns).data;
      uVar4 = (ulong)(plVar5[(int)puVar3[1] >> 1].value != ((byte)(int)puVar3[1] & 1));
    }
    else {
      plVar5 = (this->assigns).data;
      uVar4 = 0;
    }
    iVar1 = *(int *)((long)puVar3 + uVar4 * 4 + 8);
    iVar6 = iVar1 >> 1;
    if ((plVar5[iVar6].value == ((byte)iVar1 & 1)) &&
       (CVar2 = (this->vardata).data[iVar6].reason, CVar2 == cr && CVar2 != 0xffffffff)) {
      if ((*puVar3 & 0xfffffffc00000000) == 0x800000000) {
        iVar1 = (int)puVar3[1];
        uVar4 = (ulong)(plVar5[iVar1 >> 1].value != ((byte)iVar1 & 1));
      }
      else {
        uVar4 = 0;
      }
      local_1c.x = *(int *)((long)(puVar3 + 1) + uVar4 * 4);
      local_38.data = (Lit *)0x0;
      local_38.sz = 0;
      local_38.cap = 0;
      vec<Minisat::Lit>::push(&local_38,&local_1c);
      binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',&local_38,this->drup_file);
      if (local_38.data != (Lit *)0x0) {
        local_38._8_8_ = local_38._8_8_ & 0xffffffff00000000;
        free(local_38.data);
      }
    }
  }
  removeClause(this,cr,remove_from_proof);
  return;
}

Assistant:

void Solver::removeSatisfiedClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];

    if (drup_file && locked(c)) {
        // The following line was copied from Solver::locked.
        int i = c.size() != 2 ? 0 : (value(c[0]) == l_True ? 0 : 1);
        Lit unit = c[i];
#ifdef BIN_DRUP
        vec<Lit> unitClause;
        unitClause.push(unit);
        binDRUP('a', unitClause, drup_file);
#else
        fprintf(drup_file, "%i 0\n", (var(unit) + 1) * (-2 * sign(unit) + 1));
#endif
    }

    removeClause(cr, remove_from_proof);
}